

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialAnalyzerSettings.cpp
# Opt level: O1

bool __thiscall
SimpleSerialAnalyzerSettings::SetSettingsFromInterfaces(SimpleSerialAnalyzerSettings *this)

{
  U32 UVar1;
  Channel aCStack_28 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mInputChannel,aCStack_28);
  Channel::~Channel(aCStack_28);
  UVar1 = AnalyzerSettingInterfaceInteger::GetInteger();
  this->mBitRate = UVar1;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return true;
}

Assistant:

bool SimpleSerialAnalyzerSettings::SetSettingsFromInterfaces()
{
	mInputChannel = mInputChannelInterface.GetChannel();
	mBitRate = mBitRateInterface.GetInteger();

	ClearChannels();
	AddChannel( mInputChannel, "Simple Serial", true );

	return true;
}